

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

void __thiscall XPMP2::SoundSystemFMOD::SoundLogEnable(SoundSystemFMOD *this,bool bEnable)

{
  FMOD_RESULT _r;
  undefined7 in_register_00000031;
  char *pcVar1;
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  FmodError local_70;
  
  gFmodRes = FMOD_Debug_Initialize((int)CONCAT71(in_register_00000031,bEnable) * 4,2,SoundLogCB);
  if (gFmodRes != FMOD_ERR_UNSUPPORTED) {
    if (gFmodRes == FMOD_OK) {
      if (glob < 1) {
        pcVar1 = "disabled";
        if (bEnable) {
          pcVar1 = "enabled";
        }
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
               ,0xd7,"SoundLogEnable",logDEBUG,"FMOD logging has been %s.",pcVar1);
        return;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"FMOD_Debug_Initialize",&local_d1);
      _r = gFmodRes;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,&local_d2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"SoundLogEnable",&local_d3);
      FmodError::FmodError(&local_70,&local_90,_r,&local_b0,0xdc,&local_d0);
      FmodError::~FmodError(&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return;
}

Assistant:

void SoundSystemFMOD::SoundLogEnable (bool bEnable)
{
    gFmodRes = FMOD_Debug_Initialize(bEnable ? FMOD_DEBUG_LEVEL_LOG : FMOD_DEBUG_LEVEL_NONE,
                                     FMOD_DEBUG_MODE_CALLBACK, SoundLogCB, nullptr);
    if (gFmodRes == FMOD_OK) {
        LOG_MSG(logDEBUG, "FMOD logging has been %s.", bEnable ? "enabled" : "disabled");
    }
    // FMOD_ERR_UNSUPPORTED just means: not linked to fmodL, ie. "normal"
    else if (gFmodRes != FMOD_ERR_UNSUPPORTED)
    {
        FmodError("FMOD_Debug_Initialize", gFmodRes, __FILE__, __LINE__, __func__);
    }
}